

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SerializeWithCachedSizes
          (SimpleRecurrentLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SimpleRecurrentLayerParams *this_local;
  
  uVar2 = inputvectorsize(this);
  if (uVar2 != 0) {
    uVar2 = inputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  uVar2 = outputvectorsize(this);
  if (uVar2 != 0) {
    uVar2 = outputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar2,output);
  }
  bVar1 = has_activation(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->activation_->super_MessageLite,output);
  }
  bVar1 = sequenceoutput(this);
  if (bVar1) {
    bVar1 = sequenceoutput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0xf,bVar1,output);
  }
  bVar1 = hasbiasvector(this);
  if (bVar1) {
    bVar1 = hasbiasvector(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x14,bVar1,output);
  }
  bVar1 = has_weightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&this->weightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_recursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&this->recursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_biasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&this->biasvector_->super_MessageLite,output);
  }
  bVar1 = reverseinput(this);
  if (bVar1) {
    bVar1 = reverseinput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(100,bVar1,output);
  }
  return;
}

Assistant:

void SimpleRecurrentLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SimpleRecurrentLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // .CoreML.Specification.ActivationParams activation = 10;
  if (this->has_activation()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->activation_, output);
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(15, this->sequenceoutput(), output);
  }

  // bool hasBiasVector = 20;
  if (this->hasbiasvector() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->hasbiasvector(), output);
  }

  // .CoreML.Specification.WeightParams weightMatrix = 30;
  if (this->has_weightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *this->weightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams recursionMatrix = 31;
  if (this->has_recursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *this->recursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams biasVector = 32;
  if (this->has_biasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *this->biasvector_, output);
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(100, this->reverseinput(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SimpleRecurrentLayerParams)
}